

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.h
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::Formatter::operator()
          (Formatter *this,char *format,char **args,unsigned_long *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3,int *args_4,
          unsigned_long *args_5,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_6)

{
  Printer *this_00;
  char *pcVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  int x;
  unsigned_long x_00;
  unsigned_long x_01;
  string *local_1b0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_17e;
  undefined1 local_17d;
  allocator local_169;
  string local_168;
  string *local_148;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  iterator local_60;
  size_type local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_2;
  unsigned_long *args_local_1;
  char **args_local;
  char *format_local;
  Formatter *this_local;
  
  this_00 = this->printer_;
  local_17d = 1;
  local_148 = &local_140;
  pcVar1 = *args;
  local_38 = args_3;
  args_local_3 = args_2;
  args_local_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1;
  args_local_1 = (unsigned_long *)args;
  args_local = (char **)format;
  format_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_168,pcVar1,&local_169);
  ToString(&local_140,&local_168);
  local_148 = &local_120;
  ToString<unsigned_long,void>(local_148,*(Formatter **)args_local_2,x_00);
  local_148 = &local_100;
  ToString(local_148,args_local_3);
  local_148 = &local_e0;
  ToString(local_148,local_38);
  local_148 = &local_c0;
  ToString<int,void>(local_148,(Formatter *)(ulong)(uint)*args_4,x);
  local_148 = &local_a0;
  ToString<unsigned_long,void>(local_148,(Formatter *)*args_5,x_01);
  local_148 = &local_80;
  ToString(local_148,args_6);
  local_17d = 0;
  local_60 = &local_140;
  local_58 = 7;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_17e);
  __l._M_len = local_58;
  __l._M_array = local_60;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_50,__l,&local_17e);
  io::Printer::FormatInternal(this_00,&local_50,&this->vars_,(char *)args_local);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_50);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_17e);
  local_1b0 = (string *)&local_60;
  do {
    local_1b0 = local_1b0 + -1;
    std::__cxx11::string::~string((string *)local_1b0);
  } while (local_1b0 != &local_140);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  return;
}

Assistant:

void operator()(const char* format, const Args&... args) const {
    printer_->FormatInternal({ToString(args)...}, vars_, format);
  }